

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::entry_point_args_argument_buffer_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,bool append_comma)

{
  CompilerMSL *pCVar1;
  char cVar2;
  char cVar3;
  SPIRVariable *var;
  SPIRType *pSVar4;
  SPIREntryPoint *pSVar5;
  iterator iVar6;
  long *plVar7;
  const_iterator cVar8;
  undefined8 *puVar9;
  uint uVar10;
  long *plVar11;
  ulong *puVar12;
  size_type *psVar13;
  undefined7 in_register_00000011;
  ulong uVar14;
  uint __val;
  _Alloc_hider _Var15;
  undefined8 uVar16;
  ulong uVar17;
  Bitset claimed_bindings;
  undefined1 local_130 [16];
  long local_120;
  long lStack_118;
  string local_110;
  CompilerMSL *local_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long local_c0;
  ulong local_b8 [2];
  undefined4 local_a4;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_80;
  _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_78;
  ulong local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000011,append_comma);
  entry_point_arg_stage_in_abi_cxx11_(__return_storage_ptr__,this);
  local_70 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = &(this->resource_bindings)._M_h;
  local_80 = &(this->recursive_inputs)._M_h;
  uVar17 = 0;
  local_f0 = this;
  do {
    uVar10 = this->argument_buffer_ids[uVar17];
    if ((ulong)uVar10 != 0) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar10);
      var = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar10);
      pSVar4 = Compiler::get_variable_data_type((Compiler *)this,var);
      if (__return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pSVar5 = Compiler::get_entry_point((Compiler *)local_f0);
      local_130._4_4_ = (int)uVar17;
      local_130._0_4_ = pSVar5->model;
      local_130._8_4_ = 0xfffffffc;
      iVar6 = ::std::
              _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_78,(key_type *)local_130);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        if ((local_70 >> (uVar17 & 0x3f) & 1) != 0) {
          __val = local_f0->next_metal_resource_index_buffer;
          goto LAB_0021f71b;
        }
        uVar14 = uVar17 & 0xffffffff;
LAB_0021f74f:
        __val = (uint)uVar14;
        local_70 = local_70 | 1L << (uVar14 & 0x3f);
      }
      else {
        __val = *(uint *)((long)iVar6.
                                super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                                ._M_cur + 0x28);
        *(undefined1 *)
         ((long)iVar6.
                super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                ._M_cur + 0x34) = 1;
LAB_0021f71b:
        uVar14 = (ulong)__val;
        local_110._M_dataplus._M_p._0_4_ = __val;
        if (__val < 0x40) goto LAB_0021f74f;
        local_130._0_8_ = &local_68;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_130._0_8_,&local_110,local_130);
      }
      get_argument_address_space_abi_cxx11_(&local_110,local_f0,var);
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_110);
      local_130._0_8_ = &local_120;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_120 = *plVar11;
        lStack_118 = plVar7[3];
      }
      else {
        local_120 = *plVar11;
        local_130._0_8_ = (long *)*plVar7;
      }
      local_130._8_8_ = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_130._0_8_);
      if ((long *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      local_130._0_4_ = (pSVar4->super_IVariant).self.id;
      cVar8 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(local_80,(key_type *)local_130);
      if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_a0,local_f0,pSVar4,0);
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)local_a0);
        pCVar1 = local_f0;
        local_e8 = &local_d8;
        puVar12 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar12) {
          local_d8 = *puVar12;
          lStack_d0 = puVar9[3];
        }
        else {
          local_d8 = *puVar12;
          local_e8 = (ulong *)*puVar9;
        }
        local_e0 = puVar9[1];
        *puVar9 = puVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        to_restrict(local_f0,uVar10,true);
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_e8);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        puVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_110.field_2._M_allocated_capacity = *puVar12;
          local_110.field_2._8_8_ = puVar9[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar12;
          local_110._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_110._M_string_length = puVar9[1];
        *puVar9 = puVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        (*(pCVar1->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_c8,pCVar1,(ulong)uVar10,1);
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          uVar16 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_c0 + local_110._M_string_length) {
          uVar14 = 0xf;
          if (local_c8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8) {
            uVar14 = local_b8[0];
          }
          if (uVar14 < local_c0 + local_110._M_string_length) goto LAB_0021fbfa;
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::replace
                             ((ulong)&local_c8,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
        }
        else {
LAB_0021fbfa:
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_c8);
        }
        local_130._0_8_ = &local_120;
        plVar7 = puVar9 + 2;
        if ((long *)*puVar9 == plVar7) {
          local_120 = *plVar7;
          lStack_118 = puVar9[3];
        }
        else {
          local_120 = *plVar7;
          local_130._0_8_ = (long *)*puVar9;
        }
        local_130._8_8_ = puVar9[1];
        *puVar9 = plVar7;
        puVar9[1] = 0;
        *(undefined1 *)plVar7 = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_130._0_8_);
        if ((long *)local_130._0_8_ != &local_120) {
          operator_delete((void *)local_130._0_8_);
        }
        if (local_c8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8) {
          operator_delete(local_c8);
        }
        _Var15._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_0021fa80;
      }
      else {
        local_a0[0] = local_90;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"void* ","");
        pCVar1 = local_f0;
        to_restrict(local_f0,uVar10,true);
        plVar7 = (long *)::std::__cxx11::string::append((char *)local_a0);
        local_e8 = &local_d8;
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_d8 = *puVar12;
          lStack_d0 = plVar7[3];
        }
        else {
          local_d8 = *puVar12;
          local_e8 = (ulong *)*plVar7;
        }
        local_e0 = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        (*(pCVar1->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_c8,pCVar1,(ulong)uVar10,1);
        uVar14 = 0xf;
        if (local_e8 != &local_d8) {
          uVar14 = local_d8;
        }
        if (uVar14 < (ulong)(local_c0 + local_e0)) {
          uVar14 = 0xf;
          if (local_c8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8) {
            uVar14 = local_b8[0];
          }
          if (uVar14 < (ulong)(local_c0 + local_e0)) goto LAB_0021f984;
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
        }
        else {
LAB_0021f984:
          puVar9 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
        }
        puVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_110.field_2._M_allocated_capacity = *puVar12;
          local_110.field_2._8_8_ = puVar9[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar12;
          local_110._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_110._M_string_length = puVar9[1];
        *puVar9 = puVar12;
        puVar9[1] = 0;
        *(undefined1 *)puVar12 = 0;
        puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
        local_130._0_8_ = &local_120;
        plVar7 = puVar9 + 2;
        if ((long *)*puVar9 == plVar7) {
          local_120 = *plVar7;
          lStack_118 = puVar9[3];
        }
        else {
          local_120 = *plVar7;
          local_130._0_8_ = (long *)*puVar9;
        }
        local_130._8_8_ = puVar9[1];
        *puVar9 = plVar7;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_130._0_8_);
        if ((long *)local_130._0_8_ != &local_120) {
          operator_delete((void *)local_130._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        _Var15._M_p = (pointer)local_c8;
        if (local_c8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8) {
LAB_0021fa80:
          operator_delete(_Var15._M_p);
        }
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_a0[0] != local_90) {
        operator_delete(local_a0[0]);
      }
      cVar3 = '\x01';
      if (9 < __val) {
        uVar14 = (ulong)__val;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          uVar10 = (uint)uVar14;
          if (uVar10 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_0021fc10;
          }
          if (uVar10 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_0021fc10;
          }
          if (uVar10 < 10000) goto LAB_0021fc10;
          uVar14 = uVar14 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (99999 < uVar10);
        cVar3 = cVar3 + '\x01';
      }
LAB_0021fc10:
      local_e8 = &local_d8;
      ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar3);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,(uint)local_e0,__val);
      plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x2d11e3);
      psVar13 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_110.field_2._M_allocated_capacity = *psVar13;
        local_110.field_2._8_8_ = plVar7[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar13;
        local_110._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_110._M_string_length = plVar7[1];
      *plVar7 = (long)psVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_110);
      local_130._0_8_ = &local_120;
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_120 = *plVar11;
        lStack_118 = plVar7[3];
      }
      else {
        local_120 = *plVar11;
        local_130._0_8_ = (long *)*plVar7;
      }
      local_130._8_8_ = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_130._0_8_);
      if ((long *)local_130._0_8_ != &local_120) {
        operator_delete((void *)local_130._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      uVar10 = __val + 1;
      if (__val + 1 < local_f0->next_metal_resource_index_buffer) {
        uVar10 = local_f0->next_metal_resource_index_buffer;
      }
      local_f0->next_metal_resource_index_buffer = uVar10;
      this = local_f0;
    }
    uVar17 = uVar17 + 1;
    if (uVar17 == 8) {
      entry_point_args_discrete_descriptors(this,__return_storage_ptr__);
      entry_point_args_builtin(this,__return_storage_ptr__);
      if ((char)local_a4 == '\x01' && __return_storage_ptr__->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string CompilerMSL::entry_point_args_argument_buffer(bool append_comma)
{
	string ep_args = entry_point_arg_stage_in();
	Bitset claimed_bindings;

	for (uint32_t i = 0; i < kMaxArgumentBuffers; i++)
	{
		uint32_t id = argument_buffer_ids[i];
		if (id == 0)
			continue;

		add_resource_name(id);
		auto &var = get<SPIRVariable>(id);
		auto &type = get_variable_data_type(var);

		if (!ep_args.empty())
			ep_args += ", ";

		// Check if the argument buffer binding itself has been remapped.
		uint32_t buffer_binding;
		auto itr = resource_bindings.find({ get_entry_point().model, i, kArgumentBufferBinding });
		if (itr != end(resource_bindings))
		{
			buffer_binding = itr->second.first.msl_buffer;
			itr->second.second = true;
		}
		else
		{
			// As a fallback, directly map desc set <-> binding.
			// If that was taken, take the next buffer binding.
			if (claimed_bindings.get(i))
				buffer_binding = next_metal_resource_index_buffer;
			else
				buffer_binding = i;
		}

		claimed_bindings.set(buffer_binding);

		ep_args += get_argument_address_space(var) + " ";

		if (recursive_inputs.count(type.self))
			ep_args += string("void* ") + to_restrict(id, true) + to_name(id) + "_vp";
		else
			ep_args += type_to_glsl(type) + "& " + to_restrict(id, true) + to_name(id);

		ep_args += " [[buffer(" + convert_to_string(buffer_binding) + ")]]";

		next_metal_resource_index_buffer = max(next_metal_resource_index_buffer, buffer_binding + 1);
	}

	entry_point_args_discrete_descriptors(ep_args);
	entry_point_args_builtin(ep_args);

	if (!ep_args.empty() && append_comma)
		ep_args += ", ";

	return ep_args;
}